

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O0

void mserialize::
     StructDeserializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::deserialize<binlog::Range>(ClockSync *t,Range *istream)

{
  uint uVar1;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  
  uVar1 = 1;
  StructDeserializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((ClockSync *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,1),(Range *)0x10e9e8);
  uVar2 = 0;
  StructDeserializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((ClockSync *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(ulong)uVar1
             ,(Range *)0x10ea04);
  uVar3 = 0;
  StructDeserializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((ClockSync *)((ulong)in_stack_ffffffffffffffe4 << 0x20),CONCAT44(uVar2,uVar1),
             (Range *)0x10ea20);
  uVar4 = 0;
  StructDeserializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::deserialize_member<int,binlog::Range>
            ((ClockSync *)(ulong)uVar3,CONCAT44(uVar2,uVar1),(Range *)0x10ea3c);
  StructDeserializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((ClockSync *)CONCAT44(uVar4,uVar3),CONCAT44(uVar2,uVar1),(Range *)0x10ea58);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }